

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O0

uint64_t * Hacl_Bignum256_new_bn_from_bytes_le(uint32_t len,uint8_t *b)

{
  long lVar1;
  void *__dest;
  uint64_t *__src;
  uint8_t *b_00;
  uint64_t __x;
  ulong uVar2;
  undefined8 uStack_90;
  void *local_88;
  __uint64_t local_80;
  uint64_t x;
  uint64_t r1;
  uint64_t u;
  uint8_t *bj;
  uint64_t *os;
  ulong uStack_50;
  uint32_t i;
  unsigned_long __vla_expr0;
  uint local_40;
  int local_3c;
  uint32_t tmpLen;
  uint32_t bnLen;
  uint64_t *res2;
  uint64_t *res1;
  uint64_t *res;
  uint8_t *b_local;
  uint64_t *puStack_10;
  uint32_t len_local;
  
  if ((len == 0) || (0x1fffffff < (len - 1 >> 3) + 1)) {
    puStack_10 = (uint64_t *)0x0;
  }
  else {
    res = (uint64_t *)b;
    b_local._4_4_ = len;
    if (0x1fffffffffffffff < (ulong)((len - 1 >> 3) + 1)) {
      uStack_90 = 0x1f4fb1;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum256.c"
             ,0x502);
      uStack_90 = 0x1f4fbb;
      exit(0xfd);
    }
    uStack_90 = 0x1f4fd7;
    _tmpLen = (uint64_t *)calloc((ulong)((len - 1 >> 3) + 1),8);
    puStack_10 = _tmpLen;
    if (_tmpLen != (uint64_t *)0x0) {
      local_3c = (b_local._4_4_ - 1 >> 3) + 1;
      local_40 = local_3c * 8;
      uStack_50 = (ulong)local_40;
      lVar1 = -(uStack_50 + 0xf & 0xfffffffffffffff0);
      uVar2 = (ulong)local_40;
      local_88 = (void *)((long)&local_88 + lVar1);
      __vla_expr0 = (unsigned_long)&local_88;
      res2 = _tmpLen;
      res1 = _tmpLen;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x1f507c;
      memset((void *)((long)&local_88 + lVar1),0,uVar2);
      __src = res;
      __dest = local_88;
      uVar2 = (ulong)b_local._4_4_;
      *(undefined8 *)((long)&uStack_90 + lVar1) = 0x1f5092;
      memcpy(__dest,__src,uVar2);
      for (os._4_4_ = 0; os._4_4_ < (b_local._4_4_ - 1 >> 3) + 1; os._4_4_ = os._4_4_ + 1) {
        bj = (uint8_t *)_tmpLen;
        b_00 = (uint8_t *)((long)local_88 + (ulong)(os._4_4_ << 3));
        u = (uint64_t)b_00;
        *(undefined8 *)((long)&uStack_90 + lVar1) = 0x1f50d0;
        __x = load64(b_00);
        *(undefined8 *)((long)&uStack_90 + lVar1) = 0x1f50d8;
        local_80 = __uint64_identity(__x);
        *(__uint64_t *)(bj + (ulong)os._4_4_ * 8) = local_80;
        x = local_80;
        r1 = local_80;
      }
      puStack_10 = _tmpLen;
    }
  }
  return puStack_10;
}

Assistant:

uint64_t *Hacl_Bignum256_new_bn_from_bytes_le(uint32_t len, uint8_t *b)
{
  if (len == 0U || !((len - 1U) / 8U + 1U <= 536870911U))
  {
    return NULL;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), (len - 1U) / 8U + 1U);
  uint64_t *res = (uint64_t *)KRML_HOST_CALLOC((len - 1U) / 8U + 1U, sizeof (uint64_t));
  if (res == NULL)
  {
    return res;
  }
  uint64_t *res1 = res;
  uint64_t *res2 = res1;
  uint32_t bnLen = (len - 1U) / 8U + 1U;
  uint32_t tmpLen = 8U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  memcpy(tmp, b, len * sizeof (uint8_t));
  for (uint32_t i = 0U; i < (len - 1U) / 8U + 1U; i++)
  {
    uint64_t *os = res2;
    uint8_t *bj = tmp + i * 8U;
    uint64_t u = load64_le(bj);
    uint64_t r1 = u;
    uint64_t x = r1;
    os[i] = x;
  }
  return res2;
}